

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.c
# Opt level: O0

int session_end(SESSION_HANDLE session,char *condition_value,char *description)

{
  int iVar1;
  ERROR_HANDLE local_40;
  ERROR_HANDLE error_handle;
  size_t i;
  SESSION_INSTANCE *session_instance;
  int result;
  char *description_local;
  char *condition_value_local;
  SESSION_HANDLE session_local;
  
  if (session == (SESSION_HANDLE)0x0) {
    session_instance._4_4_ = 0x38c;
  }
  else {
    if ((session->session_state == SESSION_STATE_UNMAPPED) ||
       (session->session_state == SESSION_STATE_DISCARDING)) {
      session_instance._4_4_ = 0;
    }
    else {
      local_40 = (ERROR_HANDLE)0x0;
      session_instance._4_4_ = 0;
      if (condition_value != (char *)0x0) {
        local_40 = error_create(condition_value);
        if (local_40 == (ERROR_HANDLE)0x0) {
          session_instance._4_4_ = 0x39e;
        }
        else {
          iVar1 = error_set_description(local_40,description);
          if (iVar1 != 0) {
            session_instance._4_4_ = 0x3a4;
          }
        }
      }
      if (session_instance._4_4_ == 0) {
        iVar1 = send_end_frame(session,local_40);
        if (iVar1 == 0) {
          session_set_state(session,SESSION_STATE_DISCARDING);
          session_instance._4_4_ = 0;
        }
        else {
          session_instance._4_4_ = 0x3ad;
        }
      }
      if (local_40 != (ERROR_HANDLE)0x0) {
        error_destroy(local_40);
      }
    }
    for (error_handle = (ERROR_HANDLE)0x0;
        error_handle < (ERROR_HANDLE)(ulong)session->link_endpoint_count;
        error_handle = (ERROR_HANDLE)((long)&error_handle->composite_value + 1)) {
      free_link_endpoint(session->link_endpoints[(long)error_handle]);
    }
    session->link_endpoint_count = 0;
  }
  return session_instance._4_4_;
}

Assistant:

int session_end(SESSION_HANDLE session, const char* condition_value, const char* description)
{
    int result;

    if (session == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        SESSION_INSTANCE* session_instance = (SESSION_INSTANCE*)session;
        size_t i;

        if ((session_instance->session_state != SESSION_STATE_UNMAPPED) &&
            (session_instance->session_state != SESSION_STATE_DISCARDING))
        {
            ERROR_HANDLE error_handle = NULL;
            result = 0;

            if (condition_value != NULL)
            {
                error_handle = error_create(condition_value);
                if (error_handle == NULL)
                {
                    result = MU_FAILURE;
                }
                else
                {
                    if (error_set_description(error_handle, description) != 0)
                    {
                        result = MU_FAILURE;
                    }
                }
            }

            if (result == 0)
            {
                if (send_end_frame(session_instance, error_handle) != 0)
                {
                    result = MU_FAILURE;
                }
                else
                {
                    session_set_state(session_instance, SESSION_STATE_DISCARDING);
                    result = 0;
                }
            }

            if (error_handle != NULL)
            {
                error_destroy(error_handle);
            }
        }
        else
        {
            result = 0;
        }

        // all link endpoints are destroyed when the session end happens
        for (i = 0; i < session_instance->link_endpoint_count; i++)
        {
            free_link_endpoint(session_instance->link_endpoints[i]);
        }

        session_instance->link_endpoint_count = 0;
    }

    return result;
}